

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  _Elt_pointer ppVVar8;
  uint uVar9;
  ulong value;
  byte *pbVar10;
  ulong uVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar3 = token->start_;
  pbVar4 = (byte *)token->end_;
  lVar6 = 0;
  bVar12 = false;
  do {
    if ((byte *)(pcVar3 + lVar6) == pbVar4) {
      if (!bVar12) {
        cVar1 = *pcVar3;
        value = 0;
        if (cVar1 == '-') {
          uVar7 = 0x8000000000000000;
        }
        else {
          uVar7 = 0xffffffffffffffff;
        }
        pbVar10 = (byte *)(pcVar3 + (cVar1 == '-'));
        while( true ) {
          if (pbVar4 <= pbVar10) {
            if (cVar1 == '-') {
              Value::Value((Value *)&local_70,-value);
              ppVVar8 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (this->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              Value::operator=(ppVVar8[-1],(Value *)&local_70);
            }
            else if (value < 0x80000000) {
              Value::Value((Value *)&local_70,value);
              ppVVar8 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (this->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              Value::operator=(ppVVar8[-1],(Value *)&local_70);
            }
            else {
              Value::Value((Value *)&local_70,value);
              ppVVar8 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (ppVVar8 ==
                  (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVVar8 = (this->nodes_).c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              Value::operator=(ppVVar8[-1],(Value *)&local_70);
            }
            Value::~Value((Value *)&local_70);
            return true;
          }
          bVar2 = *pbVar10;
          if ((byte)(bVar2 - 0x3a) < 0xf6) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pbVar4);
            std::operator+(&local_30,"\'",&local_50);
            std::operator+(&local_70,&local_30,"\' is not a number.");
            addError(this,&local_70,token,(Location)0x0);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_30);
            std::__cxx11::string::~string((string *)&local_50);
            return false;
          }
          pbVar10 = pbVar10 + 1;
          uVar11 = (ulong)(bVar2 - 0x30);
          if ((uVar7 / 10 <= value) &&
             (((uVar7 / 10 < value || (pbVar10 != pbVar4)) || (uVar7 % 10 < uVar11)))) break;
          value = value * 10 + uVar11;
        }
      }
      bVar12 = decodeDouble(this,token);
      return bVar12;
    }
    bVar5 = !bVar12;
    bVar12 = true;
    if (bVar5) {
      uVar9 = (byte)pcVar3[lVar6] - 0x2b;
      if (uVar9 < 0x3b) {
        if ((0x400000004000009U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
          if ((ulong)uVar9 != 2) goto LAB_001b7b71;
          bVar12 = lVar6 != 0;
        }
      }
      else {
LAB_001b7b71:
        bVar12 = false;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool 
Reader::decodeNumber( Token &token )
{
   bool isDouble = false;
   for ( Location inspect = token.start_; inspect != token.end_; ++inspect )
   {
      isDouble = isDouble  
                 ||  in( *inspect, '.', 'e', 'E', '+' )  
                 ||  ( *inspect == '-'  &&  inspect != token.start_ );
   }
   if ( isDouble )
      return decodeDouble( token );
   // Attempts to parse the number as an integer. If the number is
   // larger than the maximum supported value of an integer then
   // we decode the number as a double.
   Location current = token.start_;
   bool isNegative = *current == '-';
   if ( isNegative )
      ++current;
   Value::LargestUInt maxIntegerValue = isNegative ? Value::LargestUInt(-Value::minLargestInt) 
                                                   : Value::maxLargestUInt;
   Value::LargestUInt threshold = maxIntegerValue / 10;
   Value::LargestUInt value = 0;
   while ( current < token.end_ )
   {
      Char c = *current++;
      if ( c < '0'  ||  c > '9' )
         return addError( "'" + std::string( token.start_, token.end_ ) + "' is not a number.", token );
      Value::UInt digit(c - '0');
      if ( value >= threshold )
      {
         // We've hit or exceeded the max value divided by 10 (rounded down). If
         // a) we've only just touched the limit, b) this is the last digit, and
         // c) it's small enough to fit in that rounding delta, we're okay.
         // Otherwise treat this number as a double to avoid overflow.
         if (value > threshold ||
             current != token.end_ ||
             digit > maxIntegerValue % 10)
         {
            return decodeDouble( token );
         }
      }
      value = value * 10 + digit;
   }
   if ( isNegative )
      currentValue() = -Value::LargestInt( value );
   else if ( value <= Value::LargestUInt(Value::maxInt) )
      currentValue() = Value::LargestInt( value );
   else
      currentValue() = value;
   return true;
}